

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_asof_join.cpp
# Opt level: O3

optional_ptr<duckdb::PhysicalOperator,_true> __thiscall
duckdb::PhysicalPlanGenerator::PlanAsOfLoopJoin
          (PhysicalPlanGenerator *this,LogicalComparisonJoin *op,PhysicalOperator *probe,
          PhysicalOperator *build)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar1;
  vector<duckdb::JoinCondition,_true> *this_00;
  unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> *this_01;
  pointer pJVar2;
  pointer pJVar3;
  iterator iVar4;
  ClientContext *args;
  element_type *peVar5;
  undefined8 uVar6;
  pointer pLVar7;
  iterator iVar8;
  JoinType join_type;
  byte bVar9;
  bool bVar10;
  int iVar11;
  reference pvVar12;
  pointer pLVar13;
  type binder_p;
  reference pvVar14;
  pointer pEVar15;
  Binder *this_02;
  BoundReferenceExpression *pBVar16;
  reference pvVar17;
  optional_idx oVar18;
  idx_t offset;
  pointer pBVar19;
  undefined4 extraout_var;
  pointer pPVar20;
  PhysicalOperator *pPVar21;
  PhysicalOperator *pPVar22;
  PhysicalOperator *__args;
  const_reference other;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer other_00;
  size_type sVar23;
  Expression *this_03;
  size_type __n;
  undefined8 *puVar24;
  __node_base _Var25;
  long lVar26;
  element_type *peVar27;
  size_type __n_00;
  LogicalComparisonJoin *pLVar28;
  byte bVar29;
  idx_t probe_cardinality;
  optional_idx best_function;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  groups;
  optional_ptr<duckdb::CatalogEntry,_true> arg_min_max_func;
  vector<duckdb::LogicalType,_true> window_types;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  project_list;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  comp_list;
  vector<duckdb::LogicalType,_true> comp_types;
  LogicalType pk_type;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregates;
  vector<duckdb::LogicalType,_true> aggr_types;
  string arg_min_max;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  window_select;
  AggregateFunction first_aggregate;
  FunctionBinder function_binder;
  LogicalComparisonJoin join_op;
  EntryLookupInfo function_lookup;
  FunctionBinder local_618;
  LogicalType local_608;
  long *local_5e8;
  optional_ptr<duckdb::CatalogEntry,_true> local_5e0;
  LogicalType local_5d8;
  CatalogEntry *local_5b8;
  PhysicalPlanGenerator *local_5b0;
  LogicalComparisonJoin *local_5a8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_5a0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_598;
  BoundReferenceExpression *local_580;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> local_578;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> local_570;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_568;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_550;
  vector<duckdb::LogicalType,_true> local_548;
  LogicalType local_530;
  undefined1 local_518 [16];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_508;
  __node_base local_4f0;
  undefined8 *local_4e8;
  _func_int **local_4e0;
  LogicalType *local_4d8;
  LogicalType *local_4d0;
  string *local_4c8;
  PhysicalOperator *local_4c0;
  __node_base local_4b8;
  vector<duckdb::LogicalType,_true> local_4b0;
  string local_498;
  undefined1 local_478 [16];
  undefined1 local_468 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_430 [56];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3f8;
  Expression *pEStack_3f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e8;
  undefined1 local_3d8 [16];
  BoundReferenceExpression local_3c8;
  LogicalType LStack_348;
  FunctionStability local_330;
  FunctionNullHandling FStack_32f;
  FunctionErrors FStack_32e;
  FunctionCollationHandling FStack_32d;
  undefined8 auStack_328 [14];
  element_type *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  undefined1 local_2a8 [80];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_258;
  JoinType local_237 [15];
  element_type *local_228;
  iterator local_220;
  ClientContext *local_218;
  element_type *local_210;
  iterator local_208;
  optional_ptr<duckdb::BoundAtClause,_true> local_200;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_1e0 [4];
  EntryLookupInfo local_180;
  BaseScalarFunction local_160;
  _Hash_node_base a_Stack_b0 [14];
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar29 = 0;
  local_5b0 = this;
  join_type = InverseJoinType((op->super_LogicalJoin).super_LogicalOperator.field_0x61);
  LogicalComparisonJoin::LogicalComparisonJoin
            ((LogicalComparisonJoin *)(local_2a8 + 0x10),join_type,LOGICAL_COMPARISON_JOIN);
  pvVar1 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar12 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](pvVar1,1);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar12);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_258,
             &(pLVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](pvVar1,0);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar12);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_258,
             local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pLVar13->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((op->predicate).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    pPVar22 = (PhysicalOperator *)0x0;
    goto LAB_00f26dcf;
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
             &(op->super_LogicalJoin).right_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  local_5a8 = op;
  local_4b8._M_nxt = (_Hash_node_base *)build;
  if (local_228 == (element_type *)local_220._M_current) {
    pBVar16 = (BoundReferenceExpression *)0x0;
    while( true ) {
      local_3d8._0_8_ = pBVar16;
      pvVar12 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](pvVar1,1);
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar12);
      if ((BoundReferenceExpression *)
          (((long)(pLVar13->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pLVar13->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <= pBVar16)
      break;
      if ((ClientContext *)local_220._M_current == local_218) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_228,local_220,
                   (unsigned_long *)local_3d8);
      }
      else {
        *local_220._M_current = local_3d8._0_8_;
        local_220._M_current = local_220._M_current + 1;
      }
      pBVar16 = (BoundReferenceExpression *)
                ((long)&(((BoundReferenceExpression *)local_3d8._0_8_)->super_Expression).
                        super_BaseExpression._vptr_BaseExpression + 1);
    }
  }
  pLVar28 = local_5a8;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_210,
             &(local_5a8->super_LogicalJoin).left_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  if (local_210 == (element_type *)local_208._M_current) {
    pBVar16 = (BoundReferenceExpression *)0x0;
    while( true ) {
      local_3d8._0_8_ = pBVar16;
      pvVar12 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](pvVar1,0);
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar12);
      pLVar28 = local_5a8;
      if ((BoundReferenceExpression *)
          (((long)(pLVar13->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pLVar13->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <= pBVar16)
      break;
      if ((BoundAtClause *)local_208._M_current == local_200.ptr) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_210,local_208,
                   (unsigned_long *)local_3d8);
      }
      else {
        *local_208._M_current = local_3d8._0_8_;
        local_208._M_current = local_208._M_current + 1;
      }
      pBVar16 = (BoundReferenceExpression *)
                ((long)&(((BoundReferenceExpression *)local_3d8._0_8_)->super_Expression).
                        super_BaseExpression._vptr_BaseExpression + 1);
    }
  }
  LogicalType::LogicalType(&local_530,BIGINT);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalType&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_258,
             &local_530);
  Binder::CreateBinder
            ((Binder *)local_518,local_5b0->context,(optional_ptr<duckdb::Binder,_true>)0x0,
             REGULAR_BINDER);
  local_550 = pvVar1;
  local_4c0 = probe;
  binder_p = shared_ptr<duckdb::Binder,_true>::operator*
                       ((shared_ptr<duckdb::Binder,_true> *)local_518);
  FunctionBinder::FunctionBinder((FunctionBinder *)local_2a8,binder_p);
  this_00 = &pLVar28->conditions;
  pJVar2 = (pLVar28->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pJVar3 = (pLVar28->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  __n = ((long)pJVar2 - (long)pJVar3 >> 3) * -0x5555555555555555;
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_498._M_string_length = 0;
  local_498.field_2._M_local_buf[0] = '\0';
  if (pJVar2 != pJVar3) {
    __n_00 = 0;
    do {
      pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](this_00,__n_00);
      local_3d8._0_8_ = (_Hash_node_base *)0x0;
      local_3d8._8_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar14->right);
      (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0x11])(local_478,pEVar15);
      uVar6 = local_3d8._0_8_;
      local_3d8._0_8_ = local_478._0_8_;
      local_478._0_8_ = (Expression *)0x0;
      if (((_Hash_node_base *)uVar6 != (_Hash_node_base *)0x0) &&
         ((*(code *)(*(_Hash_node_base **)uVar6)[1]._M_nxt)(),
         (Expression *)local_478._0_8_ != (Expression *)0x0)) {
        (**(code **)(*(long *)local_478._0_8_ + 8))();
      }
      pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar14->left);
      (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0x11])(local_478,pEVar15);
      uVar6 = local_3d8._8_8_;
      local_3d8._8_8_ = local_478._0_8_;
      local_478._0_8_ = (BoundReferenceExpression *)0x0;
      if (((Expression *)uVar6 != (Expression *)0x0) &&
         ((**(code **)(*(long *)uVar6 + 8))(),
         (BoundReferenceExpression *)local_478._0_8_ != (BoundReferenceExpression *)0x0)) {
        (**(code **)(*(long *)local_478._0_8_ + 8))();
      }
      uVar6 = local_3d8._0_8_;
      bVar10 = (BoundReferenceExpression *)local_3d8._0_8_ != (BoundReferenceExpression *)0x0;
      if ((BoundReferenceExpression *)local_3d8._0_8_ == (BoundReferenceExpression *)0x0) {
LAB_00f262c0:
        if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_3d8._8_8_ !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*((BaseExpression *)local_3d8._8_8_)->_vptr_BaseExpression[1])();
        }
        local_3d8._8_8_ = (Expression *)0x0;
        if ((BoundReferenceExpression *)local_3d8._0_8_ != (BoundReferenceExpression *)0x0)
        goto LAB_00f262fe;
        if ((BoundReferenceExpression *)uVar6 == (BoundReferenceExpression *)0x0) goto LAB_00f26d94;
      }
      else {
        if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
            local_3d8._8_8_ !=
            (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
          local_3c8.super_Expression.super_BaseExpression._vptr_BaseExpression._0_1_ =
               FlipComparisonExpression(pvVar14->comparison);
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>(local_1e0,(JoinCondition *)local_3d8);
          bVar9 = pvVar14->comparison - COMPARE_LESSTHAN;
          if (bVar9 < 4) {
            ::std::__cxx11::string::_M_replace
                      ((ulong)&local_498,0,(char *)local_498._M_string_length,
                       (ulong)(&DAT_01dc0a7c + *(int *)(&DAT_01dc0a7c + (ulong)bVar9 * 4)));
            __n = __n_00;
          }
          goto LAB_00f262c0;
        }
        bVar10 = false;
LAB_00f262fe:
        (*(((Expression *)local_3d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                  (local_3d8._0_8_);
        if (!bVar10) goto LAB_00f26d94;
      }
      __n_00 = __n_00 + 1;
      pLVar28 = local_5a8;
    } while (__n_00 < (ulong)(((long)(local_5a8->conditions).
                                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                     .
                                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_5a8->conditions).
                                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                     .
                                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  pPVar22 = (PhysicalOperator *)0x0;
  if ((local_237[0] < 8) && ((0xecU >> (local_237[0] & 0x1f) & 1) != 0)) {
    bVar10 = PhysicalNestedLoopJoin::IsSupported
                       (this_00,(pLVar28->super_LogicalJoin).super_LogicalOperator.field_0x61);
    if (bVar10) {
      EntryLookupInfo::EntryLookupInfo
                (&local_180,SCALAR_FUNCTION_ENTRY,&local_498,(QueryErrorContext)0xffffffffffffffff);
      this_02 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_518);
      local_3d8._0_8_ = &local_3c8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"system","");
      local_478._0_8_ = (BoundReferenceExpression *)local_468;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"main","");
      local_5e0 = Binder::GetCatalogEntry
                            (this_02,(string *)local_3d8,(string *)local_478,&local_180,RETURN_NULL)
      ;
      if ((BoundReferenceExpression *)local_478._0_8_ != (BoundReferenceExpression *)local_468) {
        operator_delete((void *)local_478._0_8_);
      }
      if ((BoundReferenceExpression *)local_3d8._0_8_ != &local_3c8) {
        operator_delete((void *)local_3d8._0_8_);
      }
      if ((local_5e0.ptr != (CatalogEntry *)0x0) &&
         (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5e0),
         (local_5e0.ptr)->type == AGGREGATE_FUNCTION_ENTRY)) {
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5e0);
        pLVar7 = local_258.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_5b8 = local_5e0.ptr;
        local_568.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_568.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_568.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          other_00 = local_258.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          do {
            lVar26 = (long)local_568.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_568.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            pBVar16 = (BoundReferenceExpression *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_3d8,other_00);
            BoundReferenceExpression::BoundReferenceExpression
                      (pBVar16,(LogicalType *)local_3d8,lVar26 >> 3);
            local_478._0_8_ = pBVar16;
            LogicalType::~LogicalType((LogicalType *)local_3d8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_568,
                       (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                        *)local_478);
            if ((BoundReferenceExpression *)local_478._0_8_ != (BoundReferenceExpression *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            other_00 = other_00 + 1;
          } while (other_00 != pLVar7);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_548,
                   &local_258);
        pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](this_00,__n);
        pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pvVar14->right);
        (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_5a0,pEVar15);
        pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_5a0);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_548,
                   &pEVar15->return_type);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_568,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_5a0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_4b0,1
                   ,&local_530,(allocator_type *)local_3d8);
        iVar8._M_current = local_208._M_current;
        local_508.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_508.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_508.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_210 != (element_type *)local_208._M_current) {
          local_580 = (BoundReferenceExpression *)&PTR__AggregateFunction_02435ff8;
          peVar27 = local_210;
          do {
            pvVar12 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](local_550,1);
            pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->(pvVar12);
            sVar23 = ((long)(pLVar13->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pLVar13->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                     (long)peVar27->_vptr_ExtraTypeInfo;
            pvVar17 = vector<duckdb::LogicalType,_true>::operator[]
                                ((vector<duckdb::LogicalType,_true> *)&local_258,sVar23);
            LogicalType::LogicalType((LogicalType *)local_478,pvVar17);
            ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
            emplace_back<duckdb::LogicalType_const&>
                      ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_4b0
                       ,(LogicalType *)local_478);
            local_5d8.id_ = INVALID;
            local_5d8.physical_type_ = ~INVALID;
            local_5d8._2_6_ = 0;
            local_5d8.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_5d8.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pBVar16 = (BoundReferenceExpression *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_3d8,(LogicalType *)local_478);
            BoundReferenceExpression::BoundReferenceExpression
                      (pBVar16,(LogicalType *)local_3d8,sVar23);
            LogicalType::~LogicalType((LogicalType *)local_3d8);
            local_3d8._0_8_ = pBVar16;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_5d8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_3d8);
            if ((BoundReferenceExpression *)local_3d8._0_8_ != (BoundReferenceExpression *)0x0) {
              (*(((Expression *)local_3d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            FirstFunctionGetter::GetFunction
                      ((AggregateFunction *)local_3d8,(LogicalType *)local_478);
            local_598.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_618.context = (ClientContext *)0x0;
            local_618.binder.ptr._0_1_ = 1;
            make_uniq<duckdb::BoundAggregateExpression,duckdb::AggregateFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr),decltype(nullptr),duckdb::AggregateType>
                      ((duckdb *)&local_608,(AggregateFunction *)local_3d8,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)&local_5d8,(void **)&local_598,&local_618.context,
                       (AggregateType *)&local_618);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_508,
                       (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                        *)&local_608);
            if ((Expression *)local_608._0_8_ != (Expression *)0x0) {
              (**(code **)&(((((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                                *)&((BaseExpression *)local_608._0_8_)->_vptr_BaseExpression)->
                             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             )._M_t.
                             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                             .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                           super_BaseExpression).type)();
            }
            local_3d8._0_8_ = local_580;
            if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
            }
            BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)&local_5d8);
            LogicalType::~LogicalType((LogicalType *)local_478);
            peVar27 = (element_type *)&peVar27->type;
          } while (peVar27 != (element_type *)iVar8._M_current);
        }
        local_580 = (BoundReferenceExpression *)local_220._M_current;
        if (local_228 != (element_type *)local_220._M_current) {
          local_4c8 = &local_5b8->name;
          local_5b8 = (CatalogEntry *)&local_5b8[1].comment.value_info_;
          local_4d8 = &local_160.return_type;
          local_4d0 = &LStack_348;
          local_4f0._M_nxt = a_Stack_b0;
          local_4e8 = auStack_328;
          local_4e0 = (_func_int **)&PTR__BaseScalarFunction_02433130;
          peVar27 = local_228;
          do {
            pvVar17 = vector<duckdb::LogicalType,_true>::operator[]
                                ((vector<duckdb::LogicalType,_true> *)&local_258,
                                 (size_type)peVar27->_vptr_ExtraTypeInfo);
            LogicalType::LogicalType(&local_5d8,pvVar17);
            ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
            emplace_back<duckdb::LogicalType_const&>
                      ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_4b0
                       ,&local_5d8);
            local_608._0_8_ = (Expression *)0x0;
            local_608.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_608.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pBVar16 = (BoundReferenceExpression *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_3d8,&local_5d8);
            BoundReferenceExpression::BoundReferenceExpression
                      (pBVar16,(LogicalType *)local_3d8,(storage_t)peVar27->_vptr_ExtraTypeInfo);
            LogicalType::~LogicalType((LogicalType *)local_3d8);
            local_3d8._0_8_ = pBVar16;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_608,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_3d8);
            if ((BoundReferenceExpression *)local_3d8._0_8_ != (BoundReferenceExpression *)0x0) {
              (*(((Expression *)local_3d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            pvVar17 = vector<duckdb::LogicalType,_true>::back(&local_548);
            lVar26 = (long)local_548.
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_548.
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            pBVar16 = (BoundReferenceExpression *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_3d8,pvVar17);
            BoundReferenceExpression::BoundReferenceExpression
                      (pBVar16,(LogicalType *)local_3d8,(lVar26 >> 3) * -0x5555555555555555 - 1);
            LogicalType::~LogicalType((LogicalType *)local_3d8);
            local_3d8._0_8_ = pBVar16;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_608,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_3d8);
            if ((BoundReferenceExpression *)local_3d8._0_8_ != (BoundReferenceExpression *)0x0) {
              (*(((Expression *)local_3d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            peVar5 = local_608.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_598.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_598.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_598.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (this_03 = (Expression *)local_608._0_8_; this_03 != (Expression *)peVar5;
                this_03 = (Expression *)&(this_03->super_BaseExpression).type) {
              pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)this_03);
              ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
              emplace_back<duckdb::LogicalType&>
                        ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                         &local_598,&pEVar15->return_type);
            }
            ErrorData::ErrorData((ErrorData *)local_478);
            oVar18 = FunctionBinder::BindFunction
                               ((FunctionBinder *)local_2a8,local_4c8,
                                (AggregateFunctionSet *)local_5b8,
                                (vector<duckdb::LogicalType,_true> *)&local_598,
                                (ErrorData *)local_478);
            local_618.context = (ClientContext *)oVar18;
            if (oVar18.index != 0xffffffffffffffff) {
              offset = optional_idx::GetIndex((optional_idx *)&local_618.context);
              FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                        ((AggregateFunction *)local_3d8,
                         (FunctionSet<duckdb::AggregateFunction> *)local_5b8,offset);
              SimpleFunction::SimpleFunction
                        (&local_160.super_SimpleFunction,(SimpleFunction *)local_3d8);
              local_160.super_SimpleFunction.super_Function._vptr_Function = local_4e0;
              LogicalType::LogicalType(local_4d8,local_4d0);
              local_160.stability = local_330;
              local_160.null_handling = FStack_32f;
              local_160.errors = FStack_32e;
              local_160.collation_handling = FStack_32d;
              local_160.super_SimpleFunction.super_Function._vptr_Function =
                   (_func_int **)&PTR__AggregateFunction_02435ff8;
              puVar24 = local_4e8;
              _Var25._M_nxt = local_4f0._M_nxt;
              for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
                (_Var25._M_nxt)->_M_nxt = (_Hash_node_base *)*puVar24;
                puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
                _Var25._M_nxt = _Var25._M_nxt + (ulong)bVar29 * -2 + 1;
              }
              *(undefined2 *)&local_4f0._M_nxt[0xd]._M_nxt = *(undefined2 *)(local_4e8 + 0xd);
              local_40 = local_2b8;
              local_38 = local_2b0._M_pi;
              if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
                }
              }
              local_3f8._M_head_impl = (Expression *)local_608._0_8_;
              pEStack_3f0 = (Expression *)
                            local_608.type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
              local_3e8 = local_608.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              local_608._0_8_ = (Expression *)0x0;
              local_608.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_608.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_5e8 = (long *)0x0;
              FunctionBinder::BindAggregateFunction
                        (&local_618,(AggregateFunction *)local_2a8,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_160,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_3f8,(AggregateType)&local_5e8);
              if (local_5e8 != (long *)0x0) {
                (**(code **)(*local_5e8 + 8))();
              }
              local_5e8 = (long *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)&local_3f8);
              local_160.super_SimpleFunction.super_Function._vptr_Function =
                   (_func_int **)&PTR__AggregateFunction_02435ff8;
              if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
              }
              BaseScalarFunction::~BaseScalarFunction(&local_160);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_508,
                         (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                          *)&local_618);
              if (local_618.binder.ptr != (Binder *)0x0) {
                (*(code *)((((local_618.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                            __weak_this_.internal.
                            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)();
              }
              local_3d8._0_8_ = &PTR__AggregateFunction_02435ff8;
              if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
              }
              BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
            }
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(local_430);
            if ((pointer)local_468._24_8_ != (pointer)(local_468 + 0x28)) {
              operator_delete((void *)local_468._24_8_);
            }
            if ((element_type *)local_478._8_8_ != (element_type *)(local_468 + 8)) {
              operator_delete((void *)local_478._8_8_);
            }
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_598);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)&local_608);
            LogicalType::~LogicalType(&local_5d8);
            if (oVar18.index == 0xffffffffffffffff) {
              pPVar22 = (PhysicalOperator *)0x0;
              goto LAB_00f270e3;
            }
            peVar27 = (element_type *)&peVar27->type;
          } while ((BoundReferenceExpression *)peVar27 != local_580);
        }
        local_478._0_8_ = (BoundReferenceExpression *)0x0;
        local_478._8_8_ = (element_type *)0x0;
        local_468._0_8_ = (_func_int **)0x0;
        local_608.id_ = 0x7d;
        local_3d8._0_8_ = (_Hash_node_base *)0x0;
        local_5d8.id_ = INVALID;
        local_5d8.physical_type_ = ~INVALID;
        local_5d8._2_6_ = 0;
        make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,decltype(nullptr),decltype(nullptr)>
                  ((ExpressionType *)&local_618.context,&local_608,(void **)&local_530,
                   (void **)local_3d8);
        pBVar19 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&local_618.context);
        pPVar22 = local_4c0;
        pvVar1 = local_550;
        pBVar19->start = UNBOUNDED_PRECEDING;
        pBVar19 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&local_618.context);
        pBVar19->end = CURRENT_ROW_ROWS;
        pBVar19 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&local_618.context);
        ::std::__cxx11::string::operator=
                  ((string *)&(pBVar19->super_Expression).super_BaseExpression.alias,"row_number");
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundWindowExpression,std::default_delete<duckdb::BoundWindowExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_478,
                   (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    *)&local_618.context);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_5d8,
                   &(pPVar22->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_5d8,
                   &local_530);
        pvVar12 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::operator[](pvVar1,0);
        pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->(pvVar12);
        iVar11 = (*pLVar13->_vptr_LogicalOperator[7])(pLVar13,local_5b0->context);
        local_618.binder.ptr = (Binder *)CONCAT44(extraout_var,iVar11);
        this_01 = &local_5b0->physical_plan;
        pPVar20 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                  ::operator->(this_01);
        pPVar21 = PhysicalPlan::
                  Make<duckdb::PhysicalStreamingWindow,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                            (pPVar20,(vector<duckdb::LogicalType,_true> *)&local_5d8,
                             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)local_478,(unsigned_long *)&local_618);
        iVar4._M_current =
             (pPVar21->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pPVar21->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
          ::_M_realloc_insert<duckdb::PhysicalOperator&>
                    ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                      *)&pPVar21->children,iVar4,pPVar22);
        }
        else {
          (iVar4._M_current)->_M_data = pPVar22;
          (pPVar21->children).
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        pPVar20 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                  ::operator->(this_01);
        pPVar22 = PhysicalPlan::
                  Make<duckdb::PhysicalNestedLoopJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                            (pPVar20,(LogicalComparisonJoin *)(local_2a8 + 0x10),
                             (PhysicalOperator *)local_4b8._M_nxt,pPVar21,
                             (vector<duckdb::JoinCondition,_true> *)local_1e0,local_237,
                             (unsigned_long *)&local_618);
        pPVar20 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                  ::operator->(this_01);
        pPVar21 = PhysicalPlan::
                  Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                            (pPVar20,&local_548,&local_568,(unsigned_long *)&local_618);
        iVar4._M_current =
             (pPVar21->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pPVar21->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
          ::_M_realloc_insert<duckdb::PhysicalOperator&>
                    ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                      *)&pPVar21->children,iVar4,pPVar22);
        }
        else {
          (iVar4._M_current)->_M_data = pPVar22;
          (pPVar21->children).
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_608._0_8_ = (Expression *)0x0;
        local_608.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_608.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_3d8._0_8_ =
             ((long)local_258.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + -1;
        make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long>
                  ((duckdb *)&local_570,&local_530,(unsigned_long *)local_3d8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_608,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                    *)&local_570);
        args = local_5b0->context;
        pPVar20 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                  ::operator->(this_01);
        __args = PhysicalPlan::
                 Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                           (pPVar20,args,&local_4b0,&local_508,
                            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)&local_608,(unsigned_long *)&local_618);
        iVar4._M_current =
             (__args->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__args->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
          ::_M_realloc_insert<duckdb::PhysicalOperator&>
                    ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                      *)&__args->children,iVar4,pPVar21);
        }
        else {
          (iVar4._M_current)->_M_data = pPVar21;
          (__args->children).
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_598.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_598.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_598.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (1 < (ulong)(((long)(__args->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__args->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       )) {
          sVar23 = 1;
          do {
            other = vector<duckdb::LogicalType,_true>::operator[](&__args->types,sVar23);
            pBVar16 = (BoundReferenceExpression *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_3d8,other);
            BoundReferenceExpression::BoundReferenceExpression
                      (pBVar16,(LogicalType *)local_3d8,sVar23);
            local_578._M_head_impl = pBVar16;
            LogicalType::~LogicalType((LogicalType *)local_3d8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_598,
                       (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                        *)&local_578);
            if (local_578._M_head_impl != (BoundReferenceExpression *)0x0) {
              (*((local_578._M_head_impl)->super_Expression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            sVar23 = sVar23 + 1;
          } while (sVar23 < (ulong)(((long)(__args->types).
                                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                           .
                                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(__args->types).
                                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                           .
                                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
        pPVar20 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                  ::operator->(this_01);
        pPVar22 = PhysicalPlan::
                  Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                            (pPVar20,&(local_5a8->super_LogicalJoin).super_LogicalOperator.types,
                             &local_598,(unsigned_long *)&local_618);
        iVar4._M_current =
             (pPVar22->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pPVar22->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
          ::_M_realloc_insert<duckdb::PhysicalOperator&>
                    ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                      *)&pPVar22->children,iVar4,__args);
        }
        else {
          (iVar4._M_current)->_M_data = __args;
          (pPVar22->children).
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_598);
        if (local_570._M_head_impl != (BoundReferenceExpression *)0x0) {
          (*((local_570._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_608);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_5d8);
        if (local_618.context != (ClientContext *)0x0) {
          (*(code *)((((local_618.context)->super_enable_shared_from_this<duckdb::ClientContext>).
                      __weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_478);
LAB_00f270e3:
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_508);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_4b0);
        if (local_5a0._M_head_impl != (Expression *)0x0) {
          (*((local_5a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_548);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_568);
        goto LAB_00f26d96;
      }
    }
LAB_00f26d94:
    pPVar22 = (PhysicalOperator *)0x0;
  }
LAB_00f26d96:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_);
  }
  LogicalType::~LogicalType(&local_530);
LAB_00f26dcf:
  LogicalComparisonJoin::~LogicalComparisonJoin((LogicalComparisonJoin *)(local_2a8 + 0x10));
  return (optional_ptr<duckdb::PhysicalOperator,_true>)pPVar22;
}

Assistant:

optional_ptr<PhysicalOperator>
PhysicalPlanGenerator::PlanAsOfLoopJoin(LogicalComparisonJoin &op, PhysicalOperator &probe, PhysicalOperator &build) {

	// Plan a inverse nested loop join, then aggregate the values to choose the optimal match for each probe row.
	// Use a row number primary key to handle duplicate probe values.
	// aggregate the fields to produce at most one match per probe row,
	// then project the columns back into the correct order and drop the primary key.
	//
	//		 ∏ * \ pk
	//		 |
	//		 Γ pk;first(P),arg_xxx(B,inequality)
	//		 |
	//		 ∏ *,inequality
	//		 |
	//       ⨝ swapped
	//     /   \ 
	//    B     W pk:row_number
	//          |
	//          P

	LogicalComparisonJoin join_op(InverseJoinType(op.join_type));

	join_op.types = op.children[1]->types;
	const auto &probe_types = op.children[0]->types;
	join_op.types.insert(join_op.types.end(), probe_types.begin(), probe_types.end());

	// TODO: We can't handle predicates right now because we would have to remap column references.
	if (op.predicate) {
		return nullptr;
	}

	//	Fill in the projection maps to simplify the code below
	//	Since NLJ doesn't support projection, but ASOF does,
	//	we have to track this carefully...
	join_op.left_projection_map = op.right_projection_map;
	if (join_op.left_projection_map.empty()) {
		for (idx_t i = 0; i < op.children[1]->types.size(); ++i) {
			join_op.left_projection_map.emplace_back(i);
		}
	}

	join_op.right_projection_map = op.left_projection_map;
	if (join_op.right_projection_map.empty()) {
		for (idx_t i = 0; i < op.children[0]->types.size(); ++i) {
			join_op.right_projection_map.emplace_back(i);
		}
	}

	// Project pk
	LogicalType pk_type = LogicalType::BIGINT;
	join_op.types.emplace_back(pk_type);

	auto binder = Binder::CreateBinder(context);
	FunctionBinder function_binder(*binder);
	auto asof_idx = op.conditions.size();
	string arg_min_max;
	for (idx_t i = 0; i < op.conditions.size(); ++i) {
		const auto &cond = op.conditions[i];
		JoinCondition nested_cond;
		nested_cond.left = cond.right->Copy();
		nested_cond.right = cond.left->Copy();
		if (!nested_cond.left || !nested_cond.right) {
			return nullptr;
		}
		nested_cond.comparison = FlipComparisonExpression(cond.comparison);
		join_op.conditions.emplace_back(std::move(nested_cond));
		switch (cond.comparison) {
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = i;
			arg_min_max = "arg_max";
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = i;
			arg_min_max = "arg_min";
			break;
		default:
			break;
		}
	}

	//	NLJ does not support some join types
	switch (join_op.join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::MARK:
	case JoinType::INNER:
	case JoinType::RIGHT:
		// Unfortunately, this does not check all the join types...
		if (!PhysicalNestedLoopJoin::IsSupported(op.conditions, op.join_type)) {
			return nullptr;
		}
		break;
	case JoinType::OUTER:
	case JoinType::LEFT:
		//	RIGHT ASOF JOINs produce the entire build table and would require grouping on all build rows,
		//	which defeats the purpose of this optimisation.
	default:
		return nullptr;
	}

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, arg_min_max);
	auto arg_min_max_func =
	    binder->GetCatalogEntry(SYSTEM_CATALOG, DEFAULT_SCHEMA, function_lookup, OnEntryNotFound::RETURN_NULL);
	//	Can't find the arg_min/max aggregate we need, so give up before we break anything.
	if (!arg_min_max_func || arg_min_max_func->type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
		return nullptr;
	}
	auto &arg_min_max_entry = arg_min_max_func->Cast<AggregateFunctionCatalogEntry>();

	// PhysicalHashAggregate requires that the arguments to aggregate functions be bound references,
	// so we Project the (shared) ordering argument on the end of the join results.
	vector<unique_ptr<Expression>> comp_list;
	for (const auto &col_type : join_op.types) {
		const auto col_idx = comp_list.size();
		comp_list.emplace_back(make_uniq<BoundReferenceExpression>(col_type, col_idx));
	}
	vector<LogicalType> comp_types = join_op.types;
	auto comp_expr = op.conditions[asof_idx].right->Copy();
	comp_types.emplace_back(comp_expr->return_type);
	comp_list.emplace_back(std::move(comp_expr));

	//	Bind the aggregates first so we can abort safely if we can't find one.
	vector<LogicalType> aggr_types(1, pk_type);

	// Wrap all the projected non-pk probe fields in `first` aggregates;
	vector<unique_ptr<Expression>> aggregates;
	for (const auto &i : join_op.right_projection_map) {
		const auto col_idx = op.children[1]->types.size() + i;
		const auto col_type = join_op.types[col_idx];
		aggr_types.emplace_back(col_type);

		vector<unique_ptr<Expression>> aggr_children;
		auto col_ref = make_uniq<BoundReferenceExpression>(col_type, col_idx);
		aggr_children.push_back(std::move(col_ref));

		auto first_aggregate = FirstFunctionGetter::GetFunction(col_type);
		auto aggr_expr = make_uniq<BoundAggregateExpression>(std::move(first_aggregate), std::move(aggr_children),
		                                                     nullptr, nullptr, AggregateType::NON_DISTINCT);
		D_ASSERT(col_type == aggr_expr->return_type);
		aggregates.emplace_back(std::move(aggr_expr));
	}

	// Wrap all the projected build fields in `arg_max/min` aggregates using the inequality ordering;
	// We are doing all this first in case we can't find a matching function.
	for (const auto &col_idx : join_op.left_projection_map) {
		const auto col_type = join_op.types[col_idx];
		aggr_types.emplace_back(col_type);

		vector<unique_ptr<Expression>> aggr_children;
		auto col_ref = make_uniq<BoundReferenceExpression>(col_type, col_idx);
		aggr_children.push_back(std::move(col_ref));
		auto comp_expr = make_uniq<BoundReferenceExpression>(comp_types.back(), comp_types.size() - 1);
		aggr_children.push_back(std::move(comp_expr));
		vector<LogicalType> child_types;
		for (const auto &child : aggr_children) {
			child_types.emplace_back(child->return_type);
		}

		auto &func = arg_min_max_entry;
		ErrorData error;
		auto best_function = function_binder.BindFunction(func.name, func.functions, child_types, error);
		if (!best_function.IsValid()) {
			return nullptr;
		}
		auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());
		auto aggr_expr = function_binder.BindAggregateFunction(bound_function, std::move(aggr_children), nullptr,
		                                                       AggregateType::NON_DISTINCT);
		D_ASSERT(col_type == aggr_expr->return_type);
		aggregates.emplace_back(std::move(aggr_expr));
	}

	// Add a synthetic primary integer key to the probe relation using streaming windowing.
	vector<unique_ptr<Expression>> window_select;
	auto pk = make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_ROW_NUMBER, pk_type, nullptr, nullptr);
	pk->start = WindowBoundary::UNBOUNDED_PRECEDING;
	pk->end = WindowBoundary::CURRENT_ROW_ROWS;
	pk->alias = "row_number";
	window_select.emplace_back(std::move(pk));

	auto window_types = probe.GetTypes();
	window_types.emplace_back(pk_type);

	idx_t probe_cardinality = op.children[0]->EstimateCardinality(context);
	auto &window = Make<PhysicalStreamingWindow>(window_types, std::move(window_select), probe_cardinality);
	window.children.emplace_back(probe);

	auto &join = Make<PhysicalNestedLoopJoin>(join_op, build, window, std::move(join_op.conditions), join_op.join_type,
	                                          probe_cardinality);

	// Plan a projection of the compare column
	auto &comp_proj = Make<PhysicalProjection>(std::move(comp_types), std::move(comp_list), probe_cardinality);
	comp_proj.children.emplace_back(join);

	// Plan an aggregation on the output of the join, grouping by key;
	// TODO: Can we make it perfect?
	// Note that the NLJ produced all fields, but only the projected ones were aggregated
	vector<unique_ptr<Expression>> groups;
	auto pk_ref = make_uniq<BoundReferenceExpression>(pk_type, join_op.types.size() - 1);
	groups.emplace_back(std::move(pk_ref));

	auto &aggr =
	    Make<PhysicalHashAggregate>(context, aggr_types, std::move(aggregates), std::move(groups), probe_cardinality);
	aggr.children.emplace_back(comp_proj);

	// Project away primary/grouping key
	// The aggregates were generated in the output order of the original ASOF,
	// so we just have to shift away the pk
	vector<unique_ptr<Expression>> project_list;
	for (column_t i = 1; i < aggr.GetTypes().size(); ++i) {
		auto col_ref = make_uniq<BoundReferenceExpression>(aggr.GetTypes()[i], i);
		project_list.emplace_back(std::move(col_ref));
	}

	auto &proj = Make<PhysicalProjection>(op.types, std::move(project_list), probe_cardinality);
	proj.children.emplace_back(aggr);
	return proj;
}